

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::AssertionHandler::handleExpr<CLI::App*const&>
          (AssertionHandler *this,ExprLhs<CLI::App_*const_&> *expr)

{
  ITransientExpression local_20;
  App **local_10;
  
  local_10 = expr->m_lhs;
  local_20.m_result = *local_10 != (App *)0x0;
  local_20.m_isBinaryExpression = false;
  local_20._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00232ed0;
  handleExpr(this,&local_20);
  ITransientExpression::~ITransientExpression(&local_20);
  return;
}

Assistant:

auto makeUnaryExpr() const -> UnaryExpr<LhsT> {
            return UnaryExpr<LhsT>{ m_lhs };
        }